

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conc_function_queue.h
# Opt level: O1

put_transaction<typename_std::decay<Func>::type> * __thiscall
density::
conc_function_queue<void(),density::basic_default_allocator<65536ul>,(density::function_type_erasure)1>
::
start_push<density_tests::ConcFunctionQueueSamples<(density::function_type_erasure)1>::func_queue_put_samples(std::ostream&)::Func>
          (put_transaction<typename_std::decay<Func>::type> *__return_storage_ptr__,void *this,
          Func_conflict *i_source)

{
  put_transaction<Func> local_38;
  
  conc_heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)1,void()>,density::basic_default_allocator<65536ul>>
  ::
  start_push<density_tests::ConcFunctionQueueSamples<(density::function_type_erasure)1>::func_queue_put_samples(std::ostream&)::Func>
            (&local_38,
             (conc_heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)1,void()>,density::basic_default_allocator<65536ul>>
              *)this,i_source);
  (__return_storage_ptr__->m_lock)._M_device = local_38.m_lock._M_device;
  (__return_storage_ptr__->m_lock)._M_owns = local_38.m_lock._M_owns;
  local_38.m_lock._M_device = (mutex_type *)0x0;
  local_38.m_lock._M_owns = false;
  (__return_storage_ptr__->m_put_transaction).m_queue = local_38.m_put_transaction.m_queue;
  (__return_storage_ptr__->m_put_transaction).m_put_data.m_control_block =
       local_38.m_put_transaction.m_put_data.m_control_block;
  (__return_storage_ptr__->m_put_transaction).m_put_data.m_user_storage =
       local_38.m_put_transaction.m_put_data.m_user_storage;
  local_38.m_put_transaction.m_queue =
       (heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)1,_void_()>,_density::basic_default_allocator<65536UL>_>
        *)0x0;
  conc_heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)1,_void_()>,_density::basic_default_allocator<65536UL>_>
  ::put_transaction<Func>::~put_transaction(&local_38);
  return __return_storage_ptr__;
}

Assistant:

put_transaction<typename std::decay<ELEMENT_TYPE>::type>
          start_push(ELEMENT_TYPE && i_source)
        {
            return m_queue.start_push(std::forward<ELEMENT_TYPE>(i_source));
        }